

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O3

int get_num_opt(archive_write *a,int *num,int high,int low,char *key,char *value)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  undefined4 in_register_0000000c;
  byte *pbVar4;
  undefined8 uVar5;
  undefined4 in_register_00000014;
  char *pcVar6;
  uint uVar7;
  byte bVar8;
  
  pcVar6 = (char *)CONCAT44(in_register_0000000c,low);
  if (pcVar6 == (char *)0x0) {
    pcVar6 = "Invalid value(empty) for option ``%s\'\'";
LAB_00272cc2:
    archive_set_error(&a->archive,-1,pcVar6,CONCAT44(in_register_00000014,high),
                      CONCAT44(in_register_00000014,high),value);
LAB_00272cfe:
    iVar2 = -0x1e;
  }
  else {
    cVar1 = *pcVar6;
    bVar8 = pcVar6[cVar1 == '-'];
    iVar2 = 0;
    uVar7 = 0;
    if (bVar8 != 0) {
      pbVar4 = (byte *)(pcVar6 + (cVar1 == '-'));
      value = (char *)0x0;
      do {
        pbVar4 = pbVar4 + 1;
        if (9 < (byte)(bVar8 - 0x30)) {
          pcVar6 = "Invalid value for option ``%s\'\'";
          goto LAB_00272cc2;
        }
        uVar7 = (uint)bVar8 + (int)value * 10;
        if (0x1002f < uVar7) {
          pcVar6 = "Invalid value(over %d) for option ``%s\'\'";
          uVar5 = 0xffff;
LAB_00272cf7:
          archive_set_error(&a->archive,-1,pcVar6,uVar5);
          goto LAB_00272cfe;
        }
        if ((int)uVar7 < 0x31) {
          pcVar6 = "Invalid value(under %d) for option ``%s\'\'";
          uVar5 = 1;
          goto LAB_00272cf7;
        }
        uVar7 = uVar7 - 0x30;
        value = (char *)(ulong)uVar7;
        bVar8 = *pbVar4;
      } while (bVar8 != 0);
    }
    uVar3 = -uVar7;
    if (cVar1 != '-') {
      uVar3 = uVar7;
    }
    *num = uVar3;
  }
  return iVar2;
}

Assistant:

static int
get_num_opt(struct archive_write *a, int *num, int high, int low,
    const char *key, const char *value)
{
	const char *p = value;
	int data = 0;
	int neg = 0;

	if (p == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid value(empty) for option ``%s''", key);
		return (ARCHIVE_FATAL);
	}
	if (*p == '-') {
		neg = 1;
		p++;
	}
	while (*p) {
		if (*p >= '0' && *p <= '9')
			data = data * 10 + *p - '0';
		else {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value for option ``%s''", key);
			return (ARCHIVE_FATAL);
		}
		if (data > high) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(over %d) for "
			    "option ``%s''", high, key);
			return (ARCHIVE_FATAL);
		}
		if (data < low) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Invalid value(under %d) for "
			    "option ``%s''", low, key);
			return (ARCHIVE_FATAL);
		}
		p++;
	}
	if (neg)
		data *= -1;
	*num = data;

	return (ARCHIVE_OK);
}